

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_convolve_scale_test.cc
# Opt level: O3

void __thiscall
anon_unknown.dwarf_29792f8::HighBDConvolveScaleTest_DISABLED_Speed_Test::TestBody
          (HighBDConvolveScaleTest_DISABLED_Speed_Test *this)

{
  ostream *poVar1;
  long lVar2;
  pointer *__ptr;
  int iVar3;
  SEARCH_METHODS *message;
  int64_t ref_time;
  int64_t tst_time;
  ACMRandom rnd;
  aom_usec_timer tst_timer;
  aom_usec_timer ref_timer;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_a8;
  AssertHelper local_a0;
  long local_98;
  internal local_90 [8];
  undefined8 *local_88;
  long local_80;
  ACMRandom local_74;
  timeval local_70;
  timeval local_60;
  timeval local_50;
  timeval local_40;
  
  local_74.random_.state_ = (Random)0xbaba;
  ConvolveScaleTestBase<unsigned_short>::Prep
            ((ConvolveScaleTestBase<unsigned_short> *)this,&local_74);
  gettimeofday(&local_50,(__timezone_ptr_t)0x0);
  iVar3 = 1000;
  do {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  gettimeofday(&local_40,(__timezone_ptr_t)0x0);
  lVar2 = local_40.tv_usec - local_50.tv_usec;
  local_98 = lVar2 + 1000000;
  if (-1 < lVar2) {
    local_98 = lVar2;
  }
  local_98 = ((lVar2 >> 0x3f) + (local_40.tv_sec - local_50.tv_sec)) * 1000000 + local_98;
  gettimeofday(&local_70,(__timezone_ptr_t)0x0);
  iVar3 = 1000;
  do {
    (*(this->super_HighBDConvolveScaleTest).super_ConvolveScaleTestBase<unsigned_short>.super_Test.
      _vptr_Test[6])(this);
    iVar3 = iVar3 + -1;
  } while (iVar3 != 0);
  gettimeofday(&local_60,(__timezone_ptr_t)0x0);
  lVar2 = local_60.tv_usec - local_70.tv_usec;
  local_80 = lVar2 + 1000000;
  if (-1 < lVar2) {
    local_80 = lVar2;
  }
  local_80 = ((lVar2 >> 0x3f) + (local_60.tv_sec - local_70.tv_sec)) * 1000000 + local_80;
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"[          ] C time = ",0x16);
  poVar1 = std::ostream::_M_insert<long>((long)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms, SIMD time = ",0x11);
  poVar1 = std::ostream::_M_insert<long>((long)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," ms\n",4);
  testing::internal::CmpHelperGT<long,long>(local_90,"ref_time","tst_time",&local_98,&local_80);
  if (local_90[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_a8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8._M_head_impl + 0x10),
               "Error: CDEFSpeedTest, SIMD slower than C.\n",0x2a);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8._M_head_impl + 0x10),"C time: ",8);
    std::ostream::_M_insert<long>((long)(local_a8._M_head_impl + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8._M_head_impl + 0x10)," us\n",4);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8._M_head_impl + 0x10),"SIMD time: ",0xb);
    std::ostream::_M_insert<long>((long)(local_a8._M_head_impl + 0x10));
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)(local_a8._M_head_impl + 0x10)," us\n",4);
    if (local_88 == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = (SEARCH_METHODS *)*local_88;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/av1_convolve_scale_test.cc"
               ,0x120,(char *)message);
    testing::internal::AssertHelper::operator=(&local_a0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper(&local_a0);
    if (local_a8._M_head_impl !=
        (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)local_a8._M_head_impl + 8))();
    }
  }
  if (local_88 != (undefined8 *)0x0) {
    if ((undefined8 *)*local_88 != local_88 + 2) {
      operator_delete((undefined8 *)*local_88);
    }
    operator_delete(local_88);
  }
  return;
}

Assistant:

TEST_P(HighBDConvolveScaleTest, DISABLED_Speed) { SpeedTest(); }